

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> __thiscall
pbrt::Integrator::Create
          (Integrator *this,string *name,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights_01;
  int iVar1;
  _Head_base<0UL,_pbrt::Integrator_*,_false> _Var2;
  char *fmt;
  memory_resource *pmVar3;
  undefined1 in_stack_fffffffffffffdc0 [16];
  undefined1 local_230 [80];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1e0;
  undefined1 local_1d8 [16];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1c8;
  undefined1 local_1c0 [24];
  SamplerHandle local_1a8;
  undefined1 local_1a0 [32];
  ParsedParameter *local_180;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_178;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_170;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_168;
  undefined1 local_160 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_148;
  undefined1 local_130 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_118;
  undefined1 local_100 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_e8;
  undefined1 local_d0 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_b8;
  undefined1 local_a0 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_88;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_70;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_58;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  this->_vptr_Integrator = (_func_int **)0x0;
  local_230._8_8_ = this;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    local_88.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(camera->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits;
    local_88.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
    local_88.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(aggregate->
                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                  ).bits;
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_a0,lights);
    _Var2._M_head_impl = (Integrator *)local_230._8_8_;
    PathIntegrator::Create
              ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
               (SamplerHandle *)
               &local_88.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (PrimitiveHandle *)
               &local_88.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish,&local_88,(FileLoc *)local_a0);
    (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
    pmVar3 = (memory_resource *)local_230._0_8_;
joined_r0x003dd621:
    if ((ParsedParameter *)local_a0._0_8_ != (ParsedParameter *)0x0) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        local_b8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
        local_b8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(sampler->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
        local_b8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(aggregate->
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      ).bits;
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_d0,lights)
        ;
        _Var2._M_head_impl = (Integrator *)local_230._8_8_;
        SimplePathIntegrator::Create
                  ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                   (SamplerHandle *)
                   &local_b8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (PrimitiveHandle *)
                   &local_b8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_b8,(FileLoc *)local_d0);
        (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
        pmVar3 = (memory_resource *)local_230._0_8_;
        local_a0._0_8_ = local_d0._0_8_;
        local_a0._16_8_ = local_d0._16_8_;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          local_e8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)(camera->
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        ).bits;
          local_e8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
          .super__Vector_impl_data._M_finish =
               (pointer)(sampler->
                        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
          local_e8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
          .super__Vector_impl_data._M_start =
               (pointer)(aggregate->
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        ).bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_100,
                     lights);
          _Var2._M_head_impl = (Integrator *)local_230._8_8_;
          LightPathIntegrator::Create
                    ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                     (SamplerHandle *)
                     &local_e8.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (PrimitiveHandle *)
                     &local_e8.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish,&local_e8,(FileLoc *)local_100);
          (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
          pmVar3 = (memory_resource *)local_230._0_8_;
          local_a0._0_8_ = local_100._0_8_;
          local_a0._16_8_ = local_100._16_8_;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            local_118.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(camera->
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          ).bits;
            local_118.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(sampler->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
            local_118.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(aggregate->
                          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                          ).bits;
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_130,
                       lights);
            _Var2._M_head_impl = (Integrator *)local_230._8_8_;
            SimpleVolPathIntegrator::Create
                      ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                       (SamplerHandle *)
                       &local_118.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (PrimitiveHandle *)
                       &local_118.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&local_118,(FileLoc *)local_130);
            (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
            pmVar3 = (memory_resource *)local_230._0_8_;
            local_a0._0_8_ = local_130._0_8_;
            local_a0._16_8_ = local_130._16_8_;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 == 0) {
              local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(camera->
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            ).bits;
              local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)(sampler->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
              local_148.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)(aggregate->
                            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                            ).bits;
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_160,
                         lights);
              _Var2._M_head_impl = (Integrator *)local_230._8_8_;
              VolPathIntegrator::Create
                        ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                         (SamplerHandle *)
                         &local_148.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (PrimitiveHandle *)
                         &local_148.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&local_148,(FileLoc *)local_160)
              ;
              (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
              pmVar3 = (memory_resource *)local_230._0_8_;
              local_a0._0_8_ = local_160._0_8_;
              local_a0._16_8_ = local_160._16_8_;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 == 0) {
                local_168.bits =
                     (camera->
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     ).bits;
                local_170.bits =
                     (sampler->
                     super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
                local_178.bits =
                     (aggregate->
                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                     ).bits;
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           (local_1a0 + 0x10),lights);
                _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                BDPTIntegrator::Create
                          ((BDPTIntegrator *)local_230,parameters,(CameraHandle *)&local_168,
                           (SamplerHandle *)&local_170,(PrimitiveHandle *)&local_178,
                           (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           (local_1a0 + 0x10),loc);
                (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
                pmVar3 = (memory_resource *)local_230._0_8_;
                local_a0._0_8_ = local_1a0._16_8_;
                local_a0._16_8_ = local_180;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 == 0) {
                  local_1a0._8_8_ =
                       (camera->
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       ).bits;
                  local_1a0._0_8_ =
                       (aggregate->
                       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                       ).bits;
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             (local_1c0 + 8),lights);
                  _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                  MLTIntegrator::Create
                            ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                             (PrimitiveHandle *)(local_1a0 + 8),
                             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             local_1a0,(FileLoc *)(local_1c0 + 8));
                  *&(_Var2._M_head_impl)->_vptr_Integrator = (_func_int **)local_230._0_8_;
                  pmVar3 = (memory_resource *)local_230._0_8_;
                  local_a0._0_8_ = local_1c0._8_8_;
                  local_a0._16_8_ =
                       local_1a8.
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       .bits;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)name);
                  if (iVar1 == 0) {
                    local_1c0._0_8_ = (ulong)&colorSpace->illuminant | 0x2000000000000;
                    local_1c8.bits =
                         (camera->
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         ).bits;
                    local_1d8._8_8_ =
                         (sampler->
                         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                         ).bits;
                    local_1d8._0_8_ =
                         (aggregate->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              (&local_58,lights);
                    _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                    lights_01.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)in_stack_fffffffffffffdc0._0_8_;
                    lights_01.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)in_stack_fffffffffffffdc0._8_8_;
                    lights_01.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)&local_58;
                    AOIntegrator::Create
                              ((ParameterDictionary *)local_230,(SpectrumHandle *)parameters,
                               (CameraHandle *)local_1c0,(SamplerHandle *)&local_1c8,
                               (PrimitiveHandle *)(local_1d8 + 8),lights_01,(FileLoc *)local_1d8);
                    pmVar3 = (memory_resource *)local_230._0_8_;
                    local_230._0_8_ = (memory_resource *)0x0;
                    *&(_Var2._M_head_impl)->_vptr_Integrator = (_func_int **)pmVar3;
                    local_a0._0_8_ =
                         local_58.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                    local_a0._16_8_ =
                         local_58.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)name);
                    if (iVar1 == 0) {
                      local_1e0.bits =
                           (camera->
                           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           ).bits;
                      local_230._72_8_ =
                           (sampler->
                           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           ).bits;
                      local_230._64_8_ =
                           (aggregate->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits;
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 (local_230 + 0x28),lights);
                      _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                      RandomWalkIntegrator::Create
                                ((ParameterDictionary *)local_230,(CameraHandle *)parameters,
                                 (SamplerHandle *)&local_1e0,(PrimitiveHandle *)(local_230 + 0x48),
                                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 (local_230 + 0x40),(FileLoc *)(local_230 + 0x28));
                      (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
                      pmVar3 = (memory_resource *)local_230._0_8_;
                      local_a0._0_8_ = local_230._40_8_;
                      local_a0._16_8_ = local_230._56_8_;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)name);
                      if (iVar1 != 0) {
                        fmt = "%s: integrator type unknown.";
                        goto LAB_003ddb09;
                      }
                      local_230._32_8_ =
                           (camera->
                           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           ).bits;
                      local_230._24_8_ =
                           (sampler->
                           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           ).bits;
                      local_230._16_8_ =
                           (aggregate->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits;
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                                (&local_70,lights);
                      _Var2._M_head_impl = (Integrator *)local_230._8_8_;
                      lights_00.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           (pointer)in_stack_fffffffffffffdc0._0_8_;
                      lights_00.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)in_stack_fffffffffffffdc0._8_8_;
                      lights_00.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_70;
                      SPPMIntegrator::Create
                                ((ParameterDictionary *)local_230,(RGBColorSpace *)parameters,
                                 (CameraHandle *)colorSpace,(SamplerHandle *)(local_230 + 0x20),
                                 (PrimitiveHandle *)(local_230 + 0x18),lights_00,
                                 (FileLoc *)(local_230 + 0x10));
                      (_Var2._M_head_impl)->_vptr_Integrator = local_230._0_8_;
                      pmVar3 = (memory_resource *)local_230._0_8_;
                      local_a0._0_8_ =
                           local_70.
                           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      local_a0._16_8_ =
                           local_70.
                           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto joined_r0x003dd621;
    }
    local_38.bits =
         (camera->
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         ).bits;
    local_40.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    FunctionIntegrator::Create
              ((FunctionIntegrator *)local_230,parameters,(CameraHandle *)&local_38,
               (SamplerHandle *)&local_40,loc);
    *(undefined8 *)local_230._8_8_ = local_230._0_8_;
    _Var2._M_head_impl = (Integrator *)local_230._8_8_;
    pmVar3 = (memory_resource *)local_230._0_8_;
  }
  if (pmVar3 != (memory_resource *)0x0) {
    ParameterDictionary::ReportUnused(parameters);
    return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           (tuple<pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>)_Var2._M_head_impl;
  }
  fmt = "%s: unable to create integrator.";
LAB_003ddb09:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "function")
        integrator = FunctionIntegrator::Create(parameters, camera, sampler, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, sampler,
                                            aggregate, lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}